

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrl_params_translate.c
# Opt level: O0

int fix_kdf_type(state state,translation_st *translation,translation_ctx_st *ctx,
                kdf_type_map_st *kdf_type_map)

{
  long lVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  translation_ctx_st *in_RCX;
  translation_st *in_RDX;
  state in_ESI;
  int in_EDI;
  int ret;
  translation_ctx_st *in_stack_000001a0;
  translation_st *in_stack_000001a8;
  state in_stack_000001b0;
  int local_24;
  
  iVar3 = default_check(in_ESI,in_RDX,in_RCX);
  if (iVar3 < 1) {
    return iVar3;
  }
  if (in_EDI == 1) {
    if (in_RDX->keytype2 != 0) {
      return 0;
    }
    if (*(int *)((long)&in_RDX->ctrl_str + 4) == -2) {
      in_RDX->ctrl_hexstr = (char *)(in_RDX + 1);
      *(undefined4 *)((long)&in_RDX->ctrl_str + 4) = 0x32;
      in_RDX->keytype2 = 1;
    }
    else {
      in_RDX->keytype2 = 2;
    }
  }
  iVar3 = default_check(in_ESI,in_RDX,in_RCX);
  if (iVar3 < 1) {
    return iVar3;
  }
  if (((in_EDI == 1) && (in_RDX->keytype2 == 2)) || ((in_EDI == 8 && (in_RDX->keytype2 == 1)))) {
    local_24 = -2;
    for (; lVar1._0_4_ = in_RCX->action_type, lVar1._4_4_ = in_RCX->ctrl_cmd, lVar1 != 0;
        in_RCX = (translation_ctx_st *)&in_RCX->ctrl_str) {
      if (*(int *)((long)&in_RDX->ctrl_str + 4) == *(int *)&in_RCX->pctx) {
        in_RDX->ctrl_hexstr = *(char **)&in_RCX->action_type;
        local_24 = 1;
        break;
      }
    }
    if (local_24 < 1) {
      return local_24;
    }
    sVar4 = strlen(in_RDX->ctrl_hexstr);
    *(int *)((long)&in_RDX->ctrl_str + 4) = (int)sVar4;
  }
  local_24 = default_fixup_args(in_stack_000001b0,in_stack_000001a8,in_stack_000001a0);
  if (local_24 < 1) {
    return local_24;
  }
  if (((in_EDI == 2) && (in_RDX->keytype2 == 1)) || ((in_EDI == 7 && (in_RDX->keytype2 == 2)))) {
    local_24 = -1;
    *(undefined4 *)((long)&in_RDX->ctrl_str + 4) = 0xffffffff;
    for (; lVar2._0_4_ = in_RCX->action_type, lVar2._4_4_ = in_RCX->ctrl_cmd, lVar2 != 0;
        in_RCX = (translation_ctx_st *)&in_RCX->ctrl_str) {
      iVar3 = strcasecmp(in_RDX->ctrl_hexstr,*(char **)&in_RCX->action_type);
      if (iVar3 == 0) {
        *(undefined4 *)((long)&in_RDX->ctrl_str + 4) = *(undefined4 *)&in_RCX->pctx;
        local_24 = 1;
        break;
      }
    }
    in_RDX->ctrl_hexstr = (char *)0x0;
  }
  else if ((in_EDI == 7) && (in_RDX->keytype2 == 1)) {
    *(undefined4 *)((long)&in_RDX->ctrl_str + 4) = 0xfffffffe;
  }
  return local_24;
}

Assistant:

static int fix_kdf_type(enum state state,
                        const struct translation_st *translation,
                        struct translation_ctx_st *ctx,
                        const struct kdf_type_map_st *kdf_type_map)
{
    /*
     * The EVP_PKEY_CTRL_DH_KDF_TYPE ctrl command is a bit special, in
     * that it's used both for setting a value, and for getting it, all
     * depending on the value if |p1|; if |p1| is -2, the backend is
     * supposed to place the current kdf type in |p2|, and if not, |p1|
     * is interpreted as the new kdf type.
     */
    int ret = 0;

    if ((ret = default_check(state, translation, ctx)) <= 0)
        return ret;

    if (state == PRE_CTRL_TO_PARAMS) {
        /*
         * In |translations|, the initial value for |ctx->action_type| must
         * be NONE.
         */
        if (!ossl_assert(ctx->action_type == NONE))
            return 0;

        /* The action type depends on the value of *p1 */
        if (ctx->p1 == -2) {
            /*
             * The OSSL_PARAMS getter needs space to store a copy of the kdf
             * type string.  We use |ctx->name_buf|, which has enough space
             * allocated.
             *
             * (this wouldn't be needed if the OSSL_xxx_PARAM_KDF_TYPE
             * had the data type OSSL_PARAM_UTF8_PTR)
             */
            ctx->p2 = ctx->name_buf;
            ctx->p1 = sizeof(ctx->name_buf);
            ctx->action_type = GET;
        } else {
            ctx->action_type = SET;
        }
    }

    if ((ret = default_check(state, translation, ctx)) <= 0)
        return ret;

    if ((state == PRE_CTRL_TO_PARAMS && ctx->action_type == SET)
        || (state == POST_PARAMS_TO_CTRL && ctx->action_type == GET)) {
        ret = -2;
        /* Convert KDF type numbers to strings */
        for (; kdf_type_map->kdf_type_str != NULL; kdf_type_map++)
            if (ctx->p1 == kdf_type_map->kdf_type_num) {
                ctx->p2 = (char *)kdf_type_map->kdf_type_str;
                ret = 1;
                break;
            }
        if (ret <= 0)
            goto end;
        ctx->p1 = strlen(ctx->p2);
    }

    if ((ret = default_fixup_args(state, translation, ctx)) <= 0)
        return ret;

    if ((state == POST_CTRL_TO_PARAMS && ctx->action_type == GET)
        || (state == PRE_PARAMS_TO_CTRL && ctx->action_type == SET)) {
        ctx->p1 = ret = -1;

        /* Convert KDF type strings to numbers */
        for (; kdf_type_map->kdf_type_str != NULL; kdf_type_map++)
            if (strcasecmp(ctx->p2, kdf_type_map->kdf_type_str) == 0) {
                ctx->p1 = kdf_type_map->kdf_type_num;
                ret = 1;
                break;
            }
        ctx->p2 = NULL;
    } else if (state == PRE_PARAMS_TO_CTRL && ctx->action_type == GET) {
        ctx->p1 = -2;
    }
 end:
    return ret;
}